

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_importance.cc
# Opt level: O3

int main(void)

{
  long lVar1;
  ostream *poVar2;
  int i;
  int iVar3;
  double dVar4;
  vec3 p;
  double local_30;
  char local_28;
  undefined7 uStack_27;
  double local_20;
  double local_18;
  
  iVar3 = 0;
  local_30 = 0.0;
  do {
    do {
      do {
        vec3::random();
        lVar1 = std::cout;
        dVar4 = local_18 * local_18 +
                (double)CONCAT71(uStack_27,local_28) * (double)CONCAT71(uStack_27,local_28) +
                local_20 * local_20;
      } while (dVar4 <= 1e-160);
    } while (1.0 < dVar4);
    dVar4 = (1.0 / SQRT(dVar4)) * local_18;
    local_30 = local_30 + (dVar4 * dVar4) / 0.07957747154594767;
    iVar3 = iVar3 + 1;
  } while (iVar3 != 1000000);
  *(uint *)(std::ostream::operator<< + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::operator<< + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar1 + -0x18)) = 0xc;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"I = ",4);
  poVar2 = std::ostream::_M_insert<double>(local_30 / 1000000.0);
  local_28 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_28,1);
  return 0;
}

Assistant:

int main() {
    int N = 1000000;
    auto sum = 0.0;
    for (int i = 0; i < N; i++) {
        vec3 d = random_unit_vector();
        auto f_d = f(d);
        sum += f_d / pdf(d);
    }
    std::cout << std::fixed << std::setprecision(12);
    std::cout << "I = " << sum / N << '\n';
}